

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BloomFilter.hpp
# Opt level: O0

void __thiscall
supermap::BloomFilter<supermap::Key<3UL>_>::add
          (BloomFilter<supermap::Key<3UL>_> *this,Key<3UL> *value)

{
  bool bVar1;
  IllegalStateException *this_00;
  long in_RDI;
  reference rVar2;
  uint64_t index;
  unsigned_long *seed;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range2;
  string data;
  BloomFilter<supermap::Key<3UL>_> *in_stack_000000d8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff28;
  _Bit_type in_stack_ffffffffffffff30;
  _Bit_type *in_stack_ffffffffffffff38;
  BloomFilter<supermap::Key<3UL>_> *in_stack_ffffffffffffff40;
  size_type in_stack_ffffffffffffff48;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff50;
  allocator<char> *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_78;
  long local_70;
  string local_68 [35];
  undefined1 local_45;
  string local_30 [48];
  
  bVar1 = std::vector<bool,_std::allocator<bool>_>::empty
                    ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffff70);
  if (!bVar1) {
    BloomFilter<supermap::Key<3ul>>::serialize_abi_cxx11_(in_stack_000000d8,(Key<3UL> *)this);
    local_70 = in_RDI + 0x18;
    local_78._M_current =
         (unsigned_long *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                   (in_stack_ffffffffffffff28);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff28);
    rVar2._M_mask = in_stack_ffffffffffffff30;
    rVar2._M_p = in_stack_ffffffffffffff38;
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)rVar2._M_mask,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_ffffffffffffff28);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator*(&local_78);
      in_stack_ffffffffffffff40 =
           (BloomFilter<supermap::Key<3UL>_> *)
           getHashWithSeed(in_stack_ffffffffffffff40,(string *)rVar2._M_p,rVar2._M_mask);
      rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
      std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffff60,true);
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++(&local_78);
    }
    std::__cxx11::string::~string(local_68);
    return;
  }
  local_45 = 1;
  this_00 = (IllegalStateException *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  supermap::IllegalStateException::IllegalStateException(this_00,local_30);
  local_45 = 0;
  __cxa_throw(this_00,&IllegalStateException::typeinfo,IllegalStateException::~IllegalStateException
             );
}

Assistant:

void add(const T &value) override {
        if (elements_.empty()) {
            throw supermap::IllegalStateException("Filter size was not reserved or was set to zero");
        }
        std::string data = serialize(value);
        for (auto &seed : seeds_) {
            std::uint64_t index = getHashWithSeed(data, seed);
            elements_[index] = true;
        }
    }